

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall
Omega_h::HostWrite<int>::HostWrite
          (HostWrite<int> *this,LO size_in,int offset,int stride,string *name_in)

{
  Write<int> local_20;
  
  Write<int>::Write(&local_20,size_in,offset,stride,name_in);
  Write<int>::Write(&this->write_,&local_20);
  Write<int>::~Write(&local_20);
  return;
}

Assistant:

HostWrite<T>::HostWrite(
    LO size_in, T offset, T stride, std::string const& name_in)
    : HostWrite<T>(Write<T>(size_in, offset, stride, name_in)) {}